

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

timestamp_t __thiscall LFPConsumer::getData(LFPConsumer *this,int16_t *data)

{
  uint uVar1;
  short *psVar2;
  size_type sVar3;
  reference pvVar4;
  short *__result;
  uint *puVar5;
  int64_t iVar6;
  HFSubConsumer *in_RDI;
  timestamp_t tVar7;
  size_t i;
  size_t pos;
  short *__last;
  ulong local_30;
  
  psVar2 = std::vector<short,_std::allocator<short>_>::data
                     ((vector<short,_std::allocator<short>_> *)0x1cd984);
  sVar3 = std::vector<short,_std::allocator<short>_>::size
                    ((vector<short,_std::allocator<short>_> *)
                     &in_RDI[1].super_HighFreqSub.dt.origin.field_2);
  (*(in_RDI->super_HighFreqSub)._vptr_HighFreqSub[5])(in_RDI,psVar2,sVar3 << 1);
  local_30 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
    if (sVar3 <= local_30) break;
    psVar2 = std::vector<short,_std::allocator<short>_>::data
                       ((vector<short,_std::allocator<short>_> *)0x1cd9ff);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),local_30);
    psVar2 = psVar2 + *pvVar4;
    __result = std::vector<short,_std::allocator<short>_>::data
                         ((vector<short,_std::allocator<short>_> *)0x1cda3f);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),local_30);
    __last = __result + *pvVar4;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),local_30 + 1);
    std::copy<short*,short*>(psVar2,__last,__result);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),local_30 + 1);
    local_30 = local_30 + 2;
  }
  puVar5 = (uint *)std::vector<short,_std::allocator<short>_>::data
                             ((vector<short,_std::allocator<short>_> *)0x1cdafd);
  uVar1 = *puVar5;
  iVar6 = HFSubConsumer::lastSysTimestamp(in_RDI);
  tVar7._4_4_ = 0;
  tVar7.trodes_timestamp = uVar1;
  tVar7.system_timestamp = iVar6;
  return tVar7;
}

Assistant:

timestamp_t LFPConsumer::getData(int16_t *data){
//    lfpPacket packet;
    readData(temp.data(), temp.size()*sizeof(int16_t));
    size_t pos = 0;
    for(size_t i = 0; i < args.indices.size(); i+=2){
        // memcpy(data+pos, temp.data()+args.indices[i], args.indices[i+1]*sizeof(int16_t));
        std::copy(temp.data()+args.indices[i], 
                  temp.data()+args.indices[i]+args.indices[i+1], 
                  data+pos);
        pos += args.indices[i+1];
    }
    return {*(uint32_t*)temp.data(), lastSysTimestamp()};
}